

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O3

void ncnn::convolution_transform_kernel_packed_int8_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  undefined8 *puVar17;
  undefined8 *puVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  uint _w;
  undefined1 (*pauVar25) [16];
  int iVar26;
  int k;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  __m128i _vindex;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar38 [32];
  undefined1 in_ZMM4 [64];
  undefined1 in_ZMM5 [64];
  undefined1 in_ZMM6 [64];
  int local_14c;
  int local_148;
  int local_144;
  ulong uVar24;
  undefined1 auVar32 [32];
  
  _w = kernel_w * kernel_h;
  uVar24 = (ulong)_w;
  if (7 < outch) {
    if (inch < 8) {
      if (inch < 2) {
        iVar5 = (outch & 1U) + ((uint)outch >> 3) + ((uint)outch >> 2 & 1) +
                (uint)(((uint)outch >> 1 & 1) != 0);
        sVar14 = 8;
        iVar13 = 8;
        iVar9 = inch;
      }
      else {
        iVar5 = (outch & 1U) + ((uint)outch >> 3) + ((uint)outch >> 2 & 1) +
                (uint)(((uint)outch >> 1 & 1) != 0);
        sVar14 = 0x10;
        iVar13 = 0x10;
        iVar9 = inch - ((uint)inch >> 1);
      }
    }
    else {
      iVar5 = (outch & 1U) + ((uint)outch >> 3) + ((uint)outch >> 2 & 1) +
              (uint)(((uint)outch >> 1 & 1) != 0);
      sVar14 = 0x40;
      iVar13 = 0x40;
      iVar9 = (inch & 1U) + ((uint)inch >> 3) + ((uint)inch >> 1 & 3);
    }
    Mat::create(kernel_tm,_w,iVar9,iVar5,sVar14,iVar13,(Allocator *)0x0);
    local_14c = _w * inch;
    auVar29._4_4_ = local_14c;
    auVar29._0_4_ = local_14c;
    auVar29._8_4_ = local_14c;
    auVar29._12_4_ = local_14c;
    auVar38._16_4_ = local_14c;
    auVar38._0_16_ = auVar29;
    auVar38._20_4_ = local_14c;
    auVar38._24_4_ = local_14c;
    auVar38._28_4_ = local_14c;
    auVar29 = vpunpckldq_avx(auVar29,ZEXT416(local_14c + _w));
    auVar29 = vshufps_avx(ZEXT416(_w),auVar29,0x41);
    iVar13 = local_14c * 2;
    auVar27._4_4_ = iVar13;
    auVar27._0_4_ = iVar13;
    auVar27._8_4_ = iVar13;
    auVar27._12_4_ = iVar13;
    auVar29 = vpaddd_avx(auVar27,auVar29);
    in_ZMM3 = ZEXT1664(auVar29);
    vpmulld_avx2(auVar38,_DAT_005aa620);
    iVar23 = local_14c * 8;
    iVar9 = local_14c * 3;
    iVar10 = local_14c * 4;
    iVar5 = local_14c * 5;
    local_144 = local_14c * 6;
    local_148 = local_14c * 7;
    iVar8 = 0;
    auVar35._16_16_ = _DAT_005ab000;
    auVar35._0_16_ = _DAT_005ab000;
    uVar15 = 0;
    do {
      pvVar1 = kernel->data;
      pauVar16 = (undefined1 (*) [16])
                 ((uVar15 >> 3) * kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
      if (inch < 8) {
        uVar6 = 0;
      }
      else {
        lVar22 = 0;
        iVar26 = 0;
        do {
          if (0 < (int)_w) {
            uVar3 = 0;
            lVar21 = lVar22;
            do {
              pauVar25 = pauVar16;
              lVar19 = 0;
              lVar20 = lVar21;
              do {
                lVar7 = lVar19;
                (*pauVar25)[lVar7] = *(undefined1 *)((long)pvVar1 + lVar20 + iVar8);
                (*pauVar25)[lVar7 + 1] =
                     *(undefined1 *)((long)pvVar1 + lVar20 + (long)iVar8 + (long)(int)_w);
                (*pauVar25)[lVar7 + 2] = *(undefined1 *)((long)pvVar1 + lVar20 + local_14c);
                (*pauVar25)[lVar7 + 3] =
                     *(undefined1 *)((long)pvVar1 + lVar20 + (long)local_14c + (long)(int)_w);
                (*pauVar25)[lVar7 + 4] = *(undefined1 *)((long)pvVar1 + lVar20 + iVar13);
                (*pauVar25)[lVar7 + 5] =
                     *(undefined1 *)((long)pvVar1 + lVar20 + (long)iVar13 + (long)(int)_w);
                (*pauVar25)[lVar7 + 6] = *(undefined1 *)((long)pvVar1 + lVar20 + iVar9);
                (*pauVar25)[lVar7 + 7] =
                     *(undefined1 *)((long)pvVar1 + lVar20 + (long)iVar9 + (long)(int)_w);
                (*pauVar25)[lVar7 + 8] = *(undefined1 *)((long)pvVar1 + lVar20 + iVar10);
                (*pauVar25)[lVar7 + 9] =
                     *(undefined1 *)((long)pvVar1 + lVar20 + (long)iVar10 + (long)(int)_w);
                (*pauVar25)[lVar7 + 10] = *(undefined1 *)((long)pvVar1 + lVar20 + iVar5);
                (*pauVar25)[lVar7 + 0xb] =
                     *(undefined1 *)((long)pvVar1 + lVar20 + (long)iVar5 + (long)(int)_w);
                (*pauVar25)[lVar7 + 0xc] = *(undefined1 *)((long)pvVar1 + lVar20 + local_144);
                (*pauVar25)[lVar7 + 0xd] =
                     *(undefined1 *)((long)pvVar1 + lVar20 + (long)local_144 + (long)(int)_w);
                (*pauVar25)[lVar7 + 0xe] = *(undefined1 *)((long)pvVar1 + lVar20 + local_148);
                (*pauVar25)[lVar7 + 0xf] =
                     *(undefined1 *)((long)pvVar1 + lVar20 + (long)local_148 + (long)(int)_w);
                lVar20 = lVar20 + (int)(_w * 2);
                lVar19 = lVar7 + 0x10;
              } while ((int)(lVar7 + 0x10) != 0x40);
              uVar3 = uVar3 + 1;
              lVar21 = lVar21 + 1;
              pauVar16 = (undefined1 (*) [16])(pauVar25[1] + lVar7);
            } while (uVar3 != uVar24);
            pauVar16 = (undefined1 (*) [16])(pauVar25[1] + lVar7);
          }
          iVar12 = iVar26 + 0xf;
          lVar22 = lVar22 + (int)(_w * 8);
          uVar6 = inch & 0xfffffff8;
          iVar26 = iVar26 + 8;
        } while (iVar12 < inch);
      }
      uVar2 = uVar6 | 1;
      while ((int)uVar2 < inch) {
        if (0 < (int)_w) {
          uVar3 = 0;
          do {
            auVar38 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
            auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
            auVar36 = vpshufb_avx2(auVar38,auVar35);
            auVar38 = vpcmpeqd_avx2(auVar38,auVar38);
            auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
            auVar38 = vpshufb_avx2(auVar38,auVar35);
            auVar29 = vpunpckldq_avx(auVar36._0_16_,auVar36._16_16_);
            in_ZMM5 = ZEXT1664(auVar38._16_16_);
            auVar27 = vpunpckldq_avx(auVar38._0_16_,auVar38._16_16_);
            in_ZMM4 = ZEXT1664(auVar27);
            auVar29 = vpunpcklqdq_avx(auVar29,auVar27);
            in_ZMM3 = ZEXT1664(auVar29);
            *pauVar16 = auVar29;
            pauVar16 = pauVar16 + 1;
            uVar3 = uVar3 + 1;
          } while (uVar24 != uVar3);
        }
        uVar2 = uVar6 + 3;
        uVar6 = uVar6 + 2;
      }
      if ((int)uVar6 < inch) {
        do {
          uVar3 = uVar24;
          if (0 < (int)_w) {
            do {
              auVar38 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
              auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
              auVar38 = vpshufb_avx2(auVar38,auVar35);
              in_ZMM4 = ZEXT1664(auVar38._16_16_);
              auVar29 = vpunpckldq_avx(auVar38._0_16_,auVar38._16_16_);
              in_ZMM3 = ZEXT1664(auVar29);
              *(long *)*pauVar16 = auVar29._0_8_;
              pauVar16 = (undefined1 (*) [16])(*pauVar16 + 8);
              uVar3 = uVar3 - 1;
            } while (uVar3 != 0);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != inch);
      }
      uVar3 = uVar15 + 8;
      uVar4 = uVar15 + 0xf;
      iVar8 = iVar8 + iVar23;
      local_14c = local_14c + iVar23;
      iVar13 = iVar13 + iVar23;
      iVar9 = iVar9 + iVar23;
      iVar10 = iVar10 + iVar23;
      iVar5 = iVar5 + iVar23;
      local_144 = local_144 + iVar23;
      local_148 = local_148 + iVar23;
      uVar15 = uVar3;
    } while (uVar4 < (uint)outch);
    goto LAB_00252d51;
  }
  iVar9 = inch;
  if (outch < 4) {
    if (outch < 2) {
      iVar5 = outch;
      if (7 < inch) {
        iVar9 = (inch & 1U) + ((uint)inch >> 3) + ((uint)inch >> 1 & 3);
        goto LAB_00252c6b;
      }
      if (1 < inch) {
        iVar9 = inch - ((uint)inch >> 1);
        goto LAB_00252d20;
      }
      sVar14 = 1;
      iVar13 = 1;
    }
    else if (inch < 8) {
      if (1 < inch) {
        iVar9 = inch - ((uint)inch >> 1);
        iVar5 = (outch & 1U) + 1;
        goto LAB_00252cce;
      }
      iVar5 = (outch & 1U) + 1;
LAB_00252d20:
      sVar14 = 2;
      iVar13 = 2;
    }
    else {
      sVar14 = 0x10;
      iVar13 = 0x10;
      iVar9 = (inch & 1U) + ((uint)inch >> 3) + ((uint)inch >> 1 & 3);
      iVar5 = (outch & 1U) + 1;
    }
  }
  else if (inch < 8) {
    if (inch < 2) {
      iVar5 = (outch & 1U) + 1 + (uint)(((uint)outch >> 1 & 1) != 0);
LAB_00252cce:
      sVar14 = 4;
      iVar13 = 4;
    }
    else {
      iVar9 = inch - ((uint)inch >> 1);
      iVar5 = (outch & 1U) + 1 + (uint)(((uint)outch >> 1 & 1) != 0);
LAB_00252c6b:
      sVar14 = 8;
      iVar13 = 8;
    }
  }
  else {
    sVar14 = 0x20;
    iVar13 = 0x20;
    iVar9 = (inch & 1U) + ((uint)inch >> 3) + ((uint)inch >> 1 & 3);
    iVar5 = (outch & 1U) + 1 + (uint)(((uint)outch >> 1 & 1) != 0);
  }
  Mat::create(kernel_tm,_w,iVar9,iVar5,sVar14,iVar13,(Allocator *)0x0);
  uVar3 = 0;
LAB_00252d51:
  uVar6 = (uint)uVar3;
  if ((int)(uVar6 | 3) < outch) {
    iVar8 = _w * inch;
    auVar30._4_4_ = iVar8;
    auVar30._0_4_ = iVar8;
    auVar30._8_4_ = iVar8;
    auVar30._12_4_ = iVar8;
    auVar29 = vpunpckldq_avx(auVar30,ZEXT416(iVar8 + _w));
    auVar29 = vshufps_avx(ZEXT416(_w),auVar29,0x41);
    iVar9 = iVar8 * 2;
    auVar34._4_4_ = iVar9;
    auVar34._0_4_ = iVar9;
    auVar34._8_4_ = iVar9;
    auVar34._12_4_ = iVar9;
    vpaddd_avx(auVar34,auVar29);
    vpmulld_avx(auVar30,_DAT_005a8c50);
    iVar5 = (uVar6 | 3) * iVar8;
    iVar13 = iVar8 * 4;
    iVar10 = (uVar6 + 2) * iVar8;
    iVar9 = (uVar6 + 1) * iVar8;
    iVar8 = uVar6 * iVar8;
    auVar36._16_16_ = _DAT_005ab000;
    auVar36._0_16_ = _DAT_005ab000;
    in_ZMM3 = ZEXT464(0xc080400);
    uVar15 = uVar3 & 0xffffffff;
    do {
      pvVar1 = kernel->data;
      puVar17 = (undefined8 *)
                ((ulong)(((uint)(uVar15 >> 3) & 0x1fffffff) + (uint)(((uint)uVar15 >> 2 & 1) != 0))
                 * kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
      if (inch < 8) {
        uVar6 = 0;
      }
      else {
        lVar22 = 0;
        iVar23 = 0;
        do {
          if (0 < (int)_w) {
            uVar3 = 0;
            lVar21 = lVar22;
            do {
              puVar18 = puVar17;
              lVar20 = 0;
              lVar19 = lVar21;
              do {
                *(undefined1 *)((long)puVar18 + lVar20) =
                     *(undefined1 *)((long)pvVar1 + lVar19 + iVar8);
                *(undefined1 *)((long)puVar18 + lVar20 + 1) =
                     *(undefined1 *)((long)pvVar1 + lVar19 + (long)iVar8 + (long)(int)_w);
                *(undefined1 *)((long)puVar18 + lVar20 + 2) =
                     *(undefined1 *)((long)pvVar1 + lVar19 + iVar9);
                *(undefined1 *)((long)puVar18 + lVar20 + 3) =
                     *(undefined1 *)((long)pvVar1 + lVar19 + (long)iVar9 + (long)(int)_w);
                *(undefined1 *)((long)puVar18 + lVar20 + 4) =
                     *(undefined1 *)((long)pvVar1 + lVar19 + iVar10);
                *(undefined1 *)((long)puVar18 + lVar20 + 5) =
                     *(undefined1 *)((long)pvVar1 + lVar19 + (long)iVar10 + (long)(int)_w);
                *(undefined1 *)((long)puVar18 + lVar20 + 6) =
                     *(undefined1 *)((long)pvVar1 + lVar19 + iVar5);
                *(undefined1 *)((long)puVar18 + lVar20 + 7) =
                     *(undefined1 *)((long)pvVar1 + lVar19 + (long)iVar5 + (long)(int)_w);
                lVar20 = lVar20 + 8;
                lVar19 = lVar19 + (int)(_w * 2);
              } while ((int)lVar20 != 0x20);
              uVar3 = uVar3 + 1;
              lVar21 = lVar21 + 1;
              puVar17 = (undefined8 *)((long)puVar18 + lVar20);
            } while (uVar3 != uVar24);
            puVar17 = (undefined8 *)((long)puVar18 + lVar20);
          }
          iVar26 = iVar23 + 0xf;
          lVar22 = lVar22 + (int)(_w * 8);
          uVar6 = inch & 0xfffffff8;
          iVar23 = iVar23 + 8;
        } while (iVar26 < inch);
      }
      uVar2 = uVar6 | 1;
      while ((int)uVar2 < inch) {
        if (0 < (int)_w) {
          uVar3 = 0;
          do {
            auVar38 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
            auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
            auVar38 = vpshufb_avx2(auVar38,auVar36);
            in_ZMM5 = ZEXT1664(auVar38._16_16_);
            auVar29 = vpunpckldq_avx(auVar38._0_16_,auVar38._16_16_);
            in_ZMM4 = ZEXT1664(auVar29);
            *puVar17 = auVar29._0_8_;
            puVar17 = puVar17 + 1;
            uVar3 = uVar3 + 1;
          } while (uVar24 != uVar3);
        }
        uVar2 = uVar6 + 3;
        uVar6 = uVar6 + 2;
      }
      if ((int)uVar6 < inch) {
        do {
          uVar3 = uVar24;
          if (0 < (int)_w) {
            do {
              auVar29 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
              auVar29 = vpgatherdd((undefined1  [16])0x0,auVar29);
              in_ZMM5 = ZEXT1664(auVar29);
              auVar29 = vpshufb_avx(auVar29,in_ZMM3._0_16_);
              in_ZMM4 = ZEXT1664(auVar29);
              *(int *)puVar17 = auVar29._0_4_;
              puVar17 = (undefined8 *)((long)puVar17 + 4);
              uVar3 = uVar3 - 1;
            } while (uVar3 != 0);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != inch);
      }
      uVar3 = uVar15 + 4;
      lVar22 = uVar15 + 7;
      iVar5 = iVar5 + iVar13;
      iVar10 = iVar10 + iVar13;
      iVar9 = iVar9 + iVar13;
      iVar8 = iVar8 + iVar13;
      uVar15 = uVar3;
    } while (lVar22 < outch);
    uVar3 = uVar3 & 0xffffffff;
  }
  uVar6 = (uint)uVar3 | 1;
  if ((int)uVar6 < outch) {
    uVar2 = _w * inch;
    auVar31._4_4_ = _w;
    auVar31._0_4_ = _w;
    auVar31._8_4_ = _w;
    auVar31._12_4_ = _w;
    auVar32._16_4_ = _w;
    auVar32._0_16_ = auVar31;
    auVar32._20_4_ = _w;
    auVar32._24_4_ = _w;
    auVar32._28_4_ = _w;
    vpmulld_avx2(auVar32,_DAT_005aa620);
    auVar29 = vpunpckldq_avx(auVar31,ZEXT416(uVar2 + _w));
    vshufps_avx(ZEXT416(uVar2),auVar29,0x41);
    auVar37._16_16_ = _DAT_005ab000;
    auVar37._0_16_ = _DAT_005ab000;
    in_ZMM3 = ZEXT464(0xc080400);
    uVar15 = uVar3 & 0xffffffff;
    do {
      lVar22 = (long)(int)(uVar2 * (uint)uVar15) + (long)kernel->data;
      lVar21 = (long)(int)(uVar6 * uVar2) + (long)kernel->data;
      pauVar16 = (undefined1 (*) [16])
                 (kernel_tm->elemsize * kernel_tm->cstep *
                  (ulong)(((uint)(uVar15 >> 2) & 1) + ((uint)(uVar15 >> 3) & 0x1fffffff) +
                         (uint)(((uint)uVar15 >> 1 & 1) != 0)) + (long)kernel_tm->data);
      uVar11 = 0;
      uVar6 = 0;
      if (7 < inch) {
        do {
          if (0 < (int)_w) {
            uVar3 = 0;
            do {
              auVar38 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
              auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
              auVar35 = vpshufb_avx2(auVar38,auVar37);
              auVar38 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
              auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
              auVar38 = vpshufb_avx2(auVar38,auVar37);
              auVar29 = vpunpckldq_avx(auVar35._0_16_,auVar35._16_16_);
              in_ZMM6 = ZEXT1664(auVar38._16_16_);
              auVar27 = vpunpckldq_avx(auVar38._0_16_,auVar38._16_16_);
              in_ZMM5 = ZEXT1664(auVar27);
              auVar29 = vpunpcklqdq_avx(auVar29,auVar27);
              in_ZMM4 = ZEXT1664(auVar29);
              *pauVar16 = auVar29;
              pauVar16 = pauVar16 + 1;
              uVar3 = uVar3 + 1;
            } while (uVar24 != uVar3);
          }
          lVar22 = lVar22 + (int)(_w * 8);
          lVar21 = lVar21 + (int)(_w * 8);
          iVar9 = uVar11 + 0xf;
          uVar11 = uVar11 + 8;
          uVar6 = inch & 0xfffffff8;
        } while (iVar9 < inch);
      }
      uVar11 = uVar6 | 1;
      while ((int)uVar11 < inch) {
        if (0 < (int)_w) {
          uVar3 = 0;
          do {
            auVar29 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
            auVar29 = vpgatherdd((undefined1  [16])0x0,auVar29);
            in_ZMM5 = ZEXT1664(auVar29);
            auVar29 = vpshufb_avx(auVar29,in_ZMM3._0_16_);
            in_ZMM4 = ZEXT1664(auVar29);
            *(int *)*pauVar16 = auVar29._0_4_;
            pauVar16 = (undefined1 (*) [16])(*pauVar16 + 4);
            uVar3 = uVar3 + 1;
          } while (uVar24 != uVar3);
        }
        lVar22 = lVar22 + (int)(_w * 2);
        lVar21 = lVar21 + (int)(_w * 2);
        uVar11 = uVar6 + 3;
        uVar6 = uVar6 + 2;
      }
      if ((int)uVar6 < inch) {
        do {
          if (0 < (int)_w) {
            uVar3 = 0;
            do {
              (*pauVar16)[0] = *(undefined1 *)(lVar22 + uVar3);
              (*pauVar16)[1] = *(undefined1 *)(lVar21 + uVar3);
              pauVar16 = (undefined1 (*) [16])(*pauVar16 + 2);
              uVar3 = uVar3 + 1;
            } while (uVar24 != uVar3);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != inch);
      }
      uVar3 = uVar15 + 2;
      lVar22 = uVar15 + 3;
      uVar6 = (uint)lVar22;
      uVar15 = uVar3;
    } while (lVar22 < outch);
  }
  if ((int)uVar3 < outch) {
    auVar28._4_4_ = _w;
    auVar28._0_4_ = _w;
    auVar28._8_4_ = _w;
    auVar28._12_4_ = _w;
    auVar28._16_4_ = _w;
    auVar28._20_4_ = _w;
    auVar28._24_4_ = _w;
    auVar28._28_4_ = _w;
    vpmulld_avx2(auVar28,_DAT_005aa620);
    uVar15 = (ulong)(int)uVar3;
    auVar33._16_16_ = _DAT_005ab000;
    auVar33._0_16_ = _DAT_005ab000;
    do {
      uVar6 = (uint)uVar15;
      lVar22 = (long)(int)(_w * inch * uVar6) + (long)kernel->data;
      puVar17 = (undefined8 *)
                (kernel_tm->elemsize * kernel_tm->cstep *
                 (ulong)((uVar6 & 1) + ((uint)(uVar15 >> 3) & 0x1fffffff) +
                         ((uint)(uVar15 >> 2) & 1) + (uint)((uVar6 >> 1 & 1) != 0)) +
                (long)kernel_tm->data);
      uVar6 = 0;
      uVar2 = 0;
      if (7 < inch) {
        do {
          if (0 < (int)_w) {
            uVar3 = 0;
            do {
              auVar38 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
              auVar38 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38);
              auVar38 = vpshufb_avx2(auVar38,auVar33);
              in_ZMM3 = ZEXT1664(auVar38._16_16_);
              auVar29 = vpunpckldq_avx(auVar38._0_16_,auVar38._16_16_);
              *puVar17 = auVar29._0_8_;
              puVar17 = puVar17 + 1;
              uVar3 = uVar3 + 1;
            } while (uVar24 != uVar3);
          }
          lVar22 = lVar22 + (int)(_w * 8);
          iVar9 = uVar6 + 0xf;
          uVar6 = uVar6 + 8;
          uVar2 = inch & 0xfffffff8;
        } while (iVar9 < inch);
      }
      if ((int)(uVar2 | 1) < inch) {
        lVar21 = lVar22 + (int)_w;
        uVar6 = uVar2;
        do {
          if (0 < (int)_w) {
            uVar3 = 0;
            do {
              *(undefined1 *)puVar17 = *(undefined1 *)(lVar22 + uVar3);
              *(undefined1 *)((long)puVar17 + 1) = *(undefined1 *)(lVar21 + uVar3);
              puVar17 = (undefined8 *)((long)puVar17 + 2);
              uVar3 = uVar3 + 1;
            } while (uVar24 != uVar3);
          }
          lVar22 = lVar22 + (int)(_w * 2);
          uVar2 = uVar6 + 2;
          iVar9 = uVar6 + 3;
          lVar21 = lVar21 + (int)(_w * 2);
          uVar6 = uVar2;
        } while (iVar9 < inch);
      }
      if ((int)uVar2 < inch) {
        do {
          if (0 < (int)_w) {
            uVar3 = 0;
            do {
              *(undefined1 *)((long)puVar17 + uVar3) = *(undefined1 *)(lVar22 + uVar3);
              uVar3 = uVar3 + 1;
            } while (uVar24 != uVar3);
            puVar17 = (undefined8 *)((long)puVar17 + uVar3);
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != inch);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != (long)outch);
  }
  return;
}

Assistant:

void convolution_transform_kernel_packed_int8_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    convolution_transform_kernel_packed_int8(kernel, kernel_tm, inch, outch, kernel_w, kernel_h);
}